

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::swizzlePixels
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,MaybeTextureSwizzle *swizzle)

{
  bool bVar1;
  TextureFormat *pTVar2;
  MaybeTextureSwizzle *swizzle_local;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  pTVar2 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  isDepthFormat(pTVar2);
  bVar1 = MaybeTextureSwizzle::isNone(swizzle);
  if ((bVar1) || (bVar1 = MaybeTextureSwizzle::isIdentitySwizzle(swizzle), bVar1)) {
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
  }
  else {
    pTVar2 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
    bVar1 = isUnormFormatType(pTVar2->type);
    if (bVar1) {
      swizzlePixels<float>(dst,src,swizzle);
    }
    else {
      pTVar2 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
      bVar1 = isUIntFormatType(pTVar2->type);
      if (bVar1) {
        swizzlePixels<unsigned_int>(dst,src,swizzle);
      }
      else {
        pTVar2 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
        bVar1 = isSIntFormatType(pTVar2->type);
        if (bVar1) {
          swizzlePixels<int>(dst,src,swizzle);
        }
      }
    }
  }
  return;
}

Assistant:

static void swizzlePixels (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, const MaybeTextureSwizzle& swizzle)
{
	if (isDepthFormat(dst.getFormat()))
		DE_ASSERT(swizzle.isNone() || swizzle.isIdentitySwizzle());

	if (swizzle.isNone() || swizzle.isIdentitySwizzle())
		tcu::copy(dst, src);
	else if (isUnormFormatType(dst.getFormat().type))
		swizzlePixels<float>(dst, src, swizzle);
	else if (isUIntFormatType(dst.getFormat().type))
		swizzlePixels<deUint32>(dst, src, swizzle);
	else if (isSIntFormatType(dst.getFormat().type))
		swizzlePixels<deInt32>(dst, src, swizzle);
	else
		DE_ASSERT(false);
}